

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_buildSeqTable(ZSTD_seqSymbol *DTableSpace,ZSTD_seqSymbol **DTablePtr,
                         symbolEncodingType_e type,U32 max,U32 maxLog,void *src,size_t srcSize,
                         U32 *baseValue,U32 *nbAdditionalBits,ZSTD_seqSymbol *defaultTable,
                         U32 flagRepeatTable)

{
  uint uVar1;
  uint in_ECX;
  undefined4 in_EDX;
  S16 *in_RSI;
  ZSTD_seqSymbol *in_RDI;
  uint in_R8D;
  byte *in_R9;
  uint unaff_retaddr;
  size_t headerSize;
  S16 norm [53];
  U32 tableLog;
  U32 nbBits;
  U32 baseline;
  U32 symbol;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  uint *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  short *in_stack_ffffffffffffff98;
  uint local_40;
  U32 *in_stack_fffffffffffffff8;
  size_t code;
  
  switch(in_EDX) {
  case 0:
    *(undefined8 *)in_RSI = norm._16_8_;
    code = 0;
    break;
  case 1:
    if (headerSize == 0) {
      code = 0xffffffffffffffb8;
    }
    else if (in_ECX < *in_R9) {
      code = 0xffffffffffffffec;
    }
    else {
      ZSTD_buildSeqTable_rle
                (in_RDI,*(U32 *)(norm._0_8_ + (ulong)(uint)*in_R9 * 4),
                 *(U32 *)(norm._8_8_ + (ulong)(uint)*in_R9 * 4));
      *(ZSTD_seqSymbol **)in_RSI = in_RDI;
      code = 1;
    }
    break;
  case 2:
    code = FSE_readNCount(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      if (in_R8D < local_40) {
        code = 0xffffffffffffffec;
      }
      else {
        ZSTD_buildFSETable((ZSTD_seqSymbol *)norm._0_8_,(short *)headerSize,unaff_retaddr,
                           in_stack_fffffffffffffff8,(U32 *)in_RDI,(uint)((ulong)in_RSI >> 0x20));
        *(ZSTD_seqSymbol **)in_RSI = in_RDI;
      }
    }
    else {
      code = 0xffffffffffffffec;
    }
    break;
  case 3:
    if (norm._24_4_ == 0) {
      code = 0xffffffffffffffec;
    }
    else {
      code = 0;
    }
    break;
  default:
    code = 0xffffffffffffffff;
  }
  return code;
}

Assistant:

static size_t ZSTD_buildSeqTable(ZSTD_seqSymbol* DTableSpace, const ZSTD_seqSymbol** DTablePtr,
                                 symbolEncodingType_e type, U32 max, U32 maxLog,
                                 const void* src, size_t srcSize,
                                 const U32* baseValue, const U32* nbAdditionalBits,
                                 const ZSTD_seqSymbol* defaultTable, U32 flagRepeatTable)
{
    switch(type)
    {
    case set_rle :
        if (!srcSize) return ERROR(srcSize_wrong);
        if ( (*(const BYTE*)src) > max) return ERROR(corruption_detected);
        {   U32 const symbol = *(const BYTE*)src;
            U32 const baseline = baseValue[symbol];
            U32 const nbBits = nbAdditionalBits[symbol];
            ZSTD_buildSeqTable_rle(DTableSpace, baseline, nbBits);
        }
        *DTablePtr = DTableSpace;
        return 1;
    case set_basic :
        *DTablePtr = defaultTable;
        return 0;
    case set_repeat:
        if (!flagRepeatTable) return ERROR(corruption_detected);
        return 0;
    case set_compressed :
        {   U32 tableLog;
            S16 norm[MaxSeq+1];
            size_t const headerSize = FSE_readNCount(norm, &max, &tableLog, src, srcSize);
            if (FSE_isError(headerSize)) return ERROR(corruption_detected);
            if (tableLog > maxLog) return ERROR(corruption_detected);
            ZSTD_buildFSETable(DTableSpace, norm, max, baseValue, nbAdditionalBits, tableLog);
            *DTablePtr = DTableSpace;
            return headerSize;
        }
    default :   /* impossible */
        assert(0);
        return ERROR(GENERIC);
    }
}